

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_tree.h
# Opt level: O2

const_iterator * __thiscall
spvtools::opt::DominatorTree::cbegin(const_iterator *__return_storage_ptr__,DominatorTree *this)

{
  DominatorTreeNode *top_node;
  TreeDFIterator<const_spvtools::opt::DominatorTreeNode> TStack_68;
  
  top_node = GetRoot(this);
  TreeDFIterator<const_spvtools::opt::DominatorTreeNode>::TreeDFIterator(&TStack_68,top_node);
  TreeDFIterator<const_spvtools::opt::DominatorTreeNode>::MoveToNextNode(&TStack_68);
  TreeDFIterator<const_spvtools::opt::DominatorTreeNode>::TreeDFIterator
            (__return_storage_ptr__,&TStack_68);
  std::
  _Deque_base<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                  *)&TStack_68.parent_iterators_);
  return __return_storage_ptr__;
}

Assistant:

const_iterator cbegin() const { return ++const_iterator(GetRoot()); }